

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

void __thiscall Parser::expected(Parser *this,char *what)

{
  TokenType TVar1;
  pointer pcVar2;
  size_t sVar3;
  ostream *poVar4;
  runtime_error *this_00;
  stringstream msg;
  undefined4 uStack_21c;
  long *local_218 [2];
  long local_208 [2];
  unsigned_long local_1f8;
  unsigned_long uStack_1f0;
  TokenType local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  unsigned_long local_1c0;
  unsigned_long uStack_1b8;
  stringstream local_1b0 [16];
  long local_1a0 [47];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Expected ",9);
  if (what == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a0 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar3 = strlen(what);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,what,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," on line ",9);
  TVar1 = (this->currentToken).type;
  pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_218,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
  local_1f8 = (this->currentToken).line;
  uStack_1f0 = (this->currentToken).col;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," column ",8);
  local_1e8 = (this->currentToken).type;
  pcVar2 = (this->currentToken).lexeme._M_dataplus._M_p;
  local_1e0[0] = local_1d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e0,pcVar2,pcVar2 + (this->currentToken).lexeme._M_string_length);
  local_1c0 = (this->currentToken).line;
  uStack_1b8 = (this->currentToken).col;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,(char *)CONCAT44(uStack_21c,TVar1));
  *(undefined ***)this_00 = &PTR__runtime_error_0012e7f8;
  __cxa_throw(this_00,&ParseException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Parser::expected(const char* what) {
    std::stringstream msg;
    msg << "Expected " << what << " on line " << token().line << " column " << token().col;
    throw ParseException(msg.str().c_str());
}